

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void CheckConfig(Abc_TgMan_t *pMan)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  char pPermE [16];
  char local_18 [16];
  
  Abc_TgExpendSymmetry(pMan,local_18);
  uVar2 = 0;
  while( true ) {
    if ((long)pMan->nVars <= (long)uVar2) {
      iVar1 = Abc_TgCannonVerify(pMan);
      if (iVar1 != 0) {
        return;
      }
      __assert_fail("Abc_TgCannonVerify(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x677,"void CheckConfig(Abc_TgMan_t *)");
    }
    if (local_18[uVar2] != pMan->pPermT[uVar2]) break;
    bVar3 = uVar2 != (uint)(int)pMan->pPermTRev[local_18[uVar2]];
    uVar2 = uVar2 + 1;
    if (bVar3) {
      __assert_fail("pMan->pPermTRev[(int)pMan->pPermT[i]] == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x675,"void CheckConfig(Abc_TgMan_t *)");
    }
  }
  __assert_fail("pPermE[i] == pMan->pPermT[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x674,"void CheckConfig(Abc_TgMan_t *)");
}

Assistant:

static void CheckConfig(Abc_TgMan_t * pMan)
{
#ifndef NDEBUG
    int i;
    char pPermE[16];
    Abc_TgExpendSymmetry(pMan, pPermE);
    for (i = 0; i < pMan->nVars; i++)
    {
        assert(pPermE[i] == pMan->pPermT[i]);
        assert(pMan->pPermTRev[(int)pMan->pPermT[i]] == i);
    }
    assert(Abc_TgCannonVerify(pMan));
#endif
}